

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

void verb_prog_twist_two_faced(OBJ_DATA *obj,CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  CHAR_DATA *in_RDX;
  char *in_RSI;
  __type_conflict2 _Var3;
  EXIT_DATA *pexit;
  int nChance;
  int in_stack_0000005c;
  void *in_stack_00000060;
  CHAR_DATA *in_stack_00000068;
  int in_stack_00000070;
  int in_stack_00000074;
  int in_stack_00008134;
  void *in_stack_00008138;
  CHAR_DATA *in_stack_00008140;
  int in_stack_00008148;
  int in_stack_0000814c;
  void *in_stack_ffffffffffffffd8;
  long lVar4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  
  uVar5 = 0;
  if ((*(char *)&in_RDX->next == '\0') ||
     ((iVar1 = strcmp((char *)in_RDX,"clockwise"), iVar1 != 0 &&
      (iVar1 = strcmp((char *)in_RDX,"counterclockwise"), iVar1 != 0)))) {
    send_to_char(in_RSI,in_RDX);
  }
  else {
    iVar1 = strcmp((char *)in_RDX,"clockwise");
    if (iVar1 == 0) {
      send_to_char(in_RSI,in_RDX);
      act(in_RSI,in_RDX,(void *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          0);
      iVar1 = 0x23;
    }
    else {
      send_to_char(in_RSI,in_RDX);
      act(in_RSI,in_RDX,(void *)CONCAT44(uVar5,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          0);
      iVar1 = 0x41;
    }
    iVar2 = number_percent();
    if (iVar1 < iVar2) {
      act(in_RSI,in_RDX,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          0);
      send_to_char(in_RSI,in_RDX);
      act(in_RSI,in_RDX,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
          0);
      spell_acid_stream(in_stack_0000814c,in_stack_00008148,in_stack_00008140,in_stack_00008138,
                        in_stack_00008134);
      if (*(short *)(in_RSI + 0x2dc) == 0) {
        send_to_char(in_RSI,in_RDX);
        act(in_RSI,in_RDX,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
            in_stack_ffffffffffffffd8,0);
        spell_plague(in_stack_00000074,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                     in_stack_0000005c);
      }
    }
    else {
      send_to_char(in_RSI,in_RDX);
      lVar4 = *(long *)(*(long *)(in_RSI + 0xa8) + 0x60);
      _Var3 = std::pow<int,int>(0,0x668949);
      *(ulong *)(lVar4 + 8) = ((long)_Var3 ^ 0xffffffffffffffffU) & *(ulong *)(lVar4 + 8);
      _Var3 = std::pow<int,int>(0,0x66896d);
      *(ulong *)(lVar4 + 8) = ((long)_Var3 ^ 0xffffffffffffffffU) & *(ulong *)(lVar4 + 8);
    }
  }
  return;
}

Assistant:

void verb_prog_twist_two_faced(OBJ_DATA *obj, CHAR_DATA *ch, char *argument)
{
	int nChance = 0;
	EXIT_DATA *pexit;
	if (!argument[0] || (strcmp(argument, "clockwise") && strcmp(argument, "counterclockwise")))
	{
		send_to_char("Which way do you want to turn it?  You could twist it clockwise or counterclockwise.\n\r", ch);
		return;
	}

	if (!strcmp(argument, "clockwise"))
	{
		send_to_char("You twist the sundial clockwise.\n\r", ch);
		act("$n twists the sundial clockwise.", ch, 0, 0, TO_ROOM);
		nChance = 35;
	}
	else
	{
		send_to_char("You twist the sundial counterclockwise.\n\r", ch);
		act("$n twists the sundial counterclockwise.", ch, 0, 0, TO_ROOM);
		nChance = 65;
	}

	if (number_percent() > nChance)
	{
		act("The faces of the statue seem to grin maniacally.", ch, 0, 0, TO_ALL);
		send_to_char("A stream of acid shoots out of the mouth of the statue at you!\n\r", ch);
		act("A stream of acid shoots out of the mouth of the statue at $n!", ch, 0, 0, TO_ROOM);
		spell_acid_stream(gsn_acid_stream, ch->level + 1, ch, ch, TARGET_CHAR);

		if (ch->ghost)
			return;

		send_to_char("A small dart flies out of the eye of the statue, barely piercing your skin.\n\r", ch);
		act("A small dart flies out of the eye of the statue, barely piercing $n's skin.", ch, 0, 0, TO_ROOM);
		spell_plague(gsn_plague, ch->level + 5, ch, ch, TARGET_CHAR);
	}
	else
	{
		send_to_char("As you rotate the sundial, a trap door beneath the table slowly swings open!\n\r", ch);

		pexit = ch->in_room->exit[Directions::Down];

		REMOVE_BIT(pexit->exit_info, EX_LOCKED);
		REMOVE_BIT(pexit->exit_info, EX_CLOSED);
	}
}